

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::setFilename(MidiFile *this,string *aname)

{
  long lVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  lVar1 = std::__cxx11::string::rfind((char)aname,0x2f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)aname);
    std::__cxx11::string::operator=((string *)&this->m_readFileName,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return;
  }
  std::__cxx11::string::_M_assign((string *)&this->m_readFileName);
  return;
}

Assistant:

void MidiFile::setFilename(const std::string& aname) {
	auto loc = aname.rfind('/');
	if (loc != std::string::npos) {
		m_readFileName = aname.substr(loc+1);
	} else {
		m_readFileName = aname;
	}
}